

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.h
# Opt level: O3

uint32 __thiscall google::protobuf::io::CodedInputStream::ReadTagFallback(CodedInputStream *this)

{
  uint8 uVar1;
  bool bVar2;
  uint8 *puVar3;
  uint8 *puVar4;
  byte *pbVar5;
  int iVar6;
  uint32 uVar8;
  uint64 uStack_10;
  int iVar7;
  
  pbVar5 = this->buffer_;
  iVar7 = (int)this->buffer_end_;
  iVar6 = iVar7 - (int)pbVar5;
  if (iVar6 < 10) {
    if (iVar6 < 1) {
      if (iVar7 == (int)pbVar5) {
        if (((0 < this->buffer_size_after_limit_) ||
            (this->total_bytes_read_ == this->current_limit_)) &&
           (this->total_bytes_read_ - this->buffer_size_after_limit_ < this->total_bytes_limit_)) {
          this->legitimate_message_end_ = true;
          return 0;
        }
      }
    }
    else if (-1 < (char)this->buffer_end_[-1]) goto LAB_001c6df1;
    puVar4 = this->buffer_;
    puVar3 = this->buffer_end_;
    if (puVar4 == puVar3) {
      bVar2 = Refresh(this);
      if (!bVar2) {
        if (this->total_bytes_read_ - this->buffer_size_after_limit_ < this->total_bytes_limit_) {
          this->legitimate_message_end_ = true;
        }
        else {
          this->legitimate_message_end_ = this->current_limit_ == this->total_bytes_limit_;
        }
        return 0;
      }
      puVar4 = this->buffer_;
      puVar3 = this->buffer_end_;
    }
    uStack_10 = 0;
    if ((puVar4 < puVar3) && (uVar1 = *puVar4, -1 < (char)uVar1)) {
      this->buffer_ = puVar4 + 1;
      uVar8 = (int)(char)uVar1;
    }
    else {
      bVar2 = ReadVarint64Fallback(this,&uStack_10);
      uVar8 = 0;
      if (bVar2) {
        uVar8 = (uint32)uStack_10;
      }
    }
    return uVar8;
  }
LAB_001c6df1:
  uVar8 = *pbVar5 & 0x7f;
  if ((char)*pbVar5 < '\0') {
    uVar8 = uVar8 | (pbVar5[1] & 0x7f) << 7;
    if ((char)pbVar5[1] < '\0') {
      uVar8 = uVar8 | (pbVar5[2] & 0x7f) << 0xe;
      if ((char)pbVar5[2] < '\0') {
        uVar8 = uVar8 | (pbVar5[3] & 0x7f) << 0x15;
        if ((char)pbVar5[3] < '\0') {
          uVar8 = uVar8 | (uint)pbVar5[4] << 0x1c;
          if ((char)pbVar5[4] < '\0') {
            pbVar5 = pbVar5 + 6;
            iVar6 = 5;
            while ((char)pbVar5[-1] < '\0') {
              pbVar5 = pbVar5 + 1;
              iVar6 = iVar6 + -1;
              if (iVar6 == 0) {
                return 0;
              }
            }
          }
          else {
            pbVar5 = pbVar5 + 5;
          }
        }
        else {
          pbVar5 = pbVar5 + 4;
        }
      }
      else {
        pbVar5 = pbVar5 + 3;
      }
    }
    else {
      pbVar5 = pbVar5 + 2;
    }
  }
  else {
    pbVar5 = pbVar5 + 1;
  }
  this->buffer_ = pbVar5;
  return uVar8;
}

Assistant:

inline int CodedInputStream::BufferSize() const {
  return buffer_end_ - buffer_;
}